

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O3

string_t duckdb::NumericHelper::FormatSigned<long>(long value,Vector *vector)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  idx_t len;
  undefined1 *puVar4;
  Vector *vector_00;
  uint64_t value_00;
  string_t sVar5;
  string_t result;
  undefined1 local_30 [16];
  
  value_00 = (value >> 0x3f ^ value) - (value >> 0x3f);
  iVar1 = UnsignedLength<unsigned_long>(value_00);
  vector_00 = (Vector *)(long)(iVar1 - (int)(value >> 0x3f));
  local_30 = (undefined1  [16])StringVector::EmptyString((StringVector *)vector,vector_00,len);
  puVar4 = local_30._8_8_;
  if (local_30._0_4_ < 0xd) {
    puVar4 = local_30 + 4;
  }
  pcVar2 = FormatUnsigned<unsigned_long>(value_00,puVar4 + (long)&vector_00->vector_type);
  if (value < 0) {
    pcVar2[-1] = '-';
  }
  uVar3 = (ulong)(uint)local_30._0_4_;
  if (uVar3 < 0xd) {
    switchD_00569a20::default(local_30 + 4 + uVar3,0,0xc - uVar3);
  }
  else {
    local_30._4_4_ = *(undefined4 *)local_30._8_8_;
  }
  sVar5.value.pointer.ptr = (char *)local_30._8_8_;
  sVar5.value._0_8_ = local_30._0_8_;
  return (string_t)sVar5.value;
}

Assistant:

static string_t FormatSigned(T value, Vector &vector) {
		typedef typename MakeUnsigned<T>::type unsigned_t;
		int8_t sign = -(value < 0);
		unsigned_t unsigned_value = unsigned_t(value ^ T(sign)) + unsigned_t(AbsValue(sign));
		auto length = UnsafeNumericCast<idx_t>(UnsignedLength<unsigned_t>(unsigned_value) + AbsValue(sign));
		string_t result = StringVector::EmptyString(vector, length);
		auto dataptr = result.GetDataWriteable();
		auto endptr = dataptr + length;
		endptr = FormatUnsigned(unsigned_value, endptr);
		if (sign) {
			*--endptr = '-';
		}
		result.Finalize();
		return result;
	}